

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::TriangleDerivateCase::iterate(TriangleDerivateCase *this)

{
  void **__return_storage_ptr__;
  float fVar1;
  code *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  deBool dVar8;
  int iVar9;
  int iVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  char *pcVar12;
  TestLog *pTVar13;
  TestError *pTVar14;
  MessageBuilder *pMVar15;
  RenderTarget *pRVar16;
  PixelFormat *pPVar17;
  float *pfVar18;
  void *data;
  Enum<int,_2UL> EVar19;
  VertexArrayBinding *local_1640;
  int local_1170;
  int local_1158;
  allocator<char> local_1129;
  string local_1128;
  allocator<char> local_1101;
  string local_1100;
  LogImage local_10e0;
  ConstPixelBufferAccess local_1050;
  allocator<char> local_1021;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  LogImage local_fd8;
  allocator<char> local_f41;
  string local_f40;
  allocator<char> local_f19;
  string local_f18;
  LogImageSet local_ef8;
  PixelBufferAccess local_eb8;
  PixelBufferAccess local_e90;
  byte local_e65;
  deUint32 local_e64;
  undefined1 local_e60 [3];
  bool isOk;
  PixelBufferAccess local_e50;
  undefined1 local_e28 [8];
  Surface errorMask;
  PixelBufferAccess local_de8;
  TextureFormat local_dc0;
  TextureFormat transferFormat;
  TextureFormat dataFormat;
  TextureFormat local_d88;
  undefined1 local_d80 [8];
  AutoRbo resRbo;
  AutoFbo resFbo;
  undefined1 local_d58 [7];
  bool isMSAA;
  undefined4 local_d40;
  undefined4 local_d3c;
  int biasLoc;
  int scaleLoc;
  deUint16 indices [6];
  allocator<char> local_d01;
  string local_d00;
  void **local_ce0;
  undefined1 local_cd8 [8];
  VertexArrayBinding vertexArrays [2];
  float coords [16];
  float positions [16];
  Enum<int,_2UL> local_ba0;
  int local_b90;
  int local_b8c;
  MessageBuilder local_b88;
  MessageBuilder local_a08;
  MessageBuilder local_888;
  MessageBuilder local_708;
  MessageBuilder local_588;
  undefined8 uStack_408;
  PixelFormat pixelFormat;
  Enum<int,_2UL> local_3e8;
  MessageBuilder local_3d8;
  undefined1 local_258 [8];
  TextureLevel result;
  AutoRbo rbo;
  AutoFbo fbo;
  int viewportY;
  int viewportX;
  IVec2 viewportSize;
  deUint32 fboFormat;
  bool useFbo;
  Random rnd;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  Functions *gl;
  TriangleDerivateCase *this_local;
  
  pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar11->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar5);
  pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  Functional::genVertexSource_abi_cxx11_
            (&local_1d8,(Functional *)(ulong)this->m_coordDataType,this->m_coordPrecision,
             (Precision)pRVar11);
  glu::makeVtxFragSources(&local_1b8,&local_1d8,&this->m_fragmentSrc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,pRVar11,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  pcVar12 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar12);
  de::Random::Random((Random *)&fboFormat,dVar6 ^ 0xbbc24);
  viewportSize.m_data[1]._3_1_ = this->m_surfaceType != SURFACETYPE_DEFAULT_FRAMEBUFFER;
  viewportSize.m_data[0] = 0x8058;
  if (this->m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    viewportSize.m_data[0] = 0x8d70;
  }
  getViewportSize((TriangleDerivateCase *)&viewportY);
  if ((viewportSize.m_data[1]._3_1_ & 1) == 0) {
    pRVar16 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar5 = tcu::RenderTarget::getWidth(pRVar16);
    iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
    local_1158 = de::Random::getInt((Random *)&fboFormat,0,iVar5 - iVar9);
  }
  else {
    local_1158 = 0;
  }
  if ((viewportSize.m_data[1]._3_1_ & 1) == 0) {
    pRVar16 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar5 = tcu::RenderTarget::getHeight(pRVar16);
    iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
    local_1170 = de::Random::getInt((Random *)&fboFormat,0,iVar5 - iVar9);
  }
  else {
    local_1170 = 0;
  }
  anon_unknown_6::AutoFbo::AutoFbo
            ((AutoFbo *)&rbo.m_rbo,(Functions *)program.m_program.m_info.linkTimeUs);
  anon_unknown_6::AutoRbo::AutoRbo
            ((AutoRbo *)&result.m_data.m_cap,(Functions *)program.m_program.m_info.linkTimeUs);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_258);
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar13,(ShaderProgram *)local_e8);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_e8);
  if (bVar4) {
    if ((viewportSize.m_data[1]._3_1_ & 1) == 0) {
      pRVar16 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar17 = tcu::RenderTarget::getPixelFormat(pRVar16);
      uStack_408._0_4_ = pPVar17->redBits;
      uStack_408._4_4_ = pPVar17->greenBits;
      pixelFormat.redBits = pPVar17->blueBits;
      pixelFormat.greenBits = pPVar17->alphaBits;
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_588,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_588,(char (*) [34])"Rendering to default framebuffer\n");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [17])"\tColor depth: R=");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)&uStack_408);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])", G=");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)((long)&uStack_408 + 4));
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])", B=");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pixelFormat.redBits);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])", A=");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&pixelFormat.greenBits);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_588);
    }
    else {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d8,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_3d8,(char (*) [28])"Rendering to FBO, format = ");
      EVar19 = glu::getTextureFormatStr(viewportSize.m_data[0]);
      pixelFormat._8_8_ = EVar19.m_getName;
      local_3e8.m_value = EVar19.m_value;
      local_3e8.m_getName = (GetNameFunc)pixelFormat._8_8_;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_3e8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [13])", samples = ");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_numSamples);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d8);
      anon_unknown_6::AutoFbo::gen((AutoFbo *)&rbo.m_rbo);
      anon_unknown_6::AutoRbo::gen((AutoRbo *)&result.m_data.m_cap);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0xa0);
      dVar6 = anon_unknown_6::AutoRbo::operator*((AutoRbo *)&result.m_data.m_cap);
      (*pcVar2)(0x8d41,dVar6);
      iVar9 = viewportSize.m_data[0];
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1240);
      iVar5 = this->m_numSamples;
      iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      (*pcVar2)(0x8d41,iVar5,iVar9,iVar7);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x78);
      dVar6 = anon_unknown_6::AutoFbo::operator*((AutoFbo *)&rbo.m_rbo);
      (*pcVar2)(0x8d40,dVar6);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x688);
      dVar6 = anon_unknown_6::AutoRbo::operator*((AutoRbo *)&result.m_data.m_cap);
      (*pcVar2)(0x8d40,0x8ce0,0x8d41,dVar6);
      do {
        dVar8 = ::deGetFalse();
        if ((dVar8 != 0) ||
           (iVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x170))(0x8d40),
           iVar5 != 0x8cd5)) {
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,(char *)0x0,
                     "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                     ,0x2a6);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
    }
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_b88,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<(&local_b88,(char (*) [5])0x2bc091a);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_coordMin);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])" -> ");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_coordMax);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [22])"v_coord.x = in.x * x\n");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [22])"v_coord.y = in.y * y\n");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [28])"v_coord.z = in.z * (x+y)/2\n")
    ;
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(char (*) [34])"v_coord.w = in.w * (1 - (x+y)/2)\n");
    pTVar13 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(&local_a08,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<(&local_a08,(char (*) [10])"u_scale: ");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_derivScale);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [11])", u_bias: ");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_derivBias);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(char (*) [44])" (displayed values have scale/bias removed)");
    pTVar13 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(&local_888,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<(&local_888,(char (*) [11])"Viewport: ");
    local_b8c = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_b8c);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2a8224a);
    local_b90 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_b90);
    pTVar13 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(&local_708,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_708,(char (*) [35])"GL_FRAGMENT_SHADER_DERIVATE_HINT: ");
    EVar19 = glu::getHintModeStr(this->m_hint);
    local_ba0.m_getName = EVar19.m_getName;
    local_ba0.m_value = EVar19.m_value;
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_ba0);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_708);
    tcu::MessageBuilder::~MessageBuilder(&local_888);
    tcu::MessageBuilder::~MessageBuilder(&local_a08);
    tcu::MessageBuilder::~MessageBuilder(&local_b88);
    coords[0xe] = -1.0;
    coords[0xf] = -1.0;
    pfVar18 = tcu::Vector<float,_4>::x(&this->m_coordMin);
    vertexArrays[1].pointer.data._0_4_ = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::y(&this->m_coordMin);
    vertexArrays[1].pointer.data._4_4_ = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMin);
    coords[0] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMax);
    coords[1] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::x(&this->m_coordMin);
    coords[2] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::y(&this->m_coordMax);
    coords[3] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMin);
    fVar1 = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMax);
    coords[4] = (fVar1 + *pfVar18) * 0.5;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMin);
    fVar1 = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMax);
    coords[5] = (fVar1 + *pfVar18) * 0.5;
    pfVar18 = tcu::Vector<float,_4>::x(&this->m_coordMax);
    coords[6] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::y(&this->m_coordMin);
    coords[7] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMin);
    fVar1 = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMax);
    coords[8] = (fVar1 + *pfVar18) * 0.5;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMin);
    fVar1 = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMax);
    coords[9] = (fVar1 + *pfVar18) * 0.5;
    pfVar18 = tcu::Vector<float,_4>::x(&this->m_coordMax);
    coords[10] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::y(&this->m_coordMax);
    coords[0xb] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::z(&this->m_coordMax);
    coords[0xc] = *pfVar18;
    pfVar18 = tcu::Vector<float,_4>::w(&this->m_coordMin);
    coords[0xd] = *pfVar18;
    indices[3]._0_1_ = 1;
    local_ce0 = (void **)local_cd8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d00,"a_position",&local_d01)
    ;
    glu::va::Float((VertexArrayBinding *)local_cd8,&local_d00,4,4,0,coords + 0xe);
    __return_storage_ptr__ = &vertexArrays[0].pointer.data;
    local_ce0 = __return_storage_ptr__;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(indices + 4),"a_coord",(allocator<char> *)((long)indices + 7));
    glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,(string *)(indices + 4),4,4,0,
                   (float *)&vertexArrays[1].pointer.data);
    indices[3]._0_1_ = 0;
    std::__cxx11::string::~string((string *)(indices + 4));
    std::allocator<char>::~allocator((allocator<char> *)((long)indices + 7));
    std::__cxx11::string::~string((string *)&local_d00);
    std::allocator<char>::~allocator(&local_d01);
    _biasLoc = 0x2000100020000;
    indices[0] = 3;
    indices[1] = 1;
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))
              (0x3e000000,0x3e800000,0x3f000000,0x3f800000);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4500);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0x4e8))(0xbd0);
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    (*pcVar2)(dVar6);
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0xb48);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    local_d3c = (*pcVar2)(dVar6,"u_scale");
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0xb48);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    local_d40 = (*pcVar2)(dVar6,"u_bias");
    uVar3 = local_d3c;
    switch(this->m_dataType) {
    case TYPE_FLOAT:
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x14e0);
      pfVar18 = tcu::Vector<float,_4>::x(&this->m_derivScale);
      (*pcVar2)(*pfVar18,uVar3);
      uVar3 = local_d40;
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x14e0);
      pfVar18 = tcu::Vector<float,_4>::x(&this->m_derivBias);
      (*pcVar2)(*pfVar18,uVar3);
      break;
    case TYPE_FLOAT_VEC2:
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1528);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivScale);
      (*pcVar2)(uVar3,1,pfVar18);
      uVar3 = local_d40;
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1528);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivBias);
      (*pcVar2)(uVar3,1,pfVar18);
      break;
    case TYPE_FLOAT_VEC3:
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1568);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivScale);
      (*pcVar2)(uVar3,1,pfVar18);
      uVar3 = local_d40;
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1568);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivBias);
      (*pcVar2)(uVar3,1,pfVar18);
      break;
    case TYPE_FLOAT_VEC4:
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x15a8);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivScale);
      (*pcVar2)(uVar3,1,pfVar18);
      uVar3 = local_d40;
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x15a8);
      pfVar18 = tcu::Vector<float,_4>::getPtr(&this->m_derivBias);
      (*pcVar2)(uVar3,1,pfVar18);
    }
    pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    deqp::gls::setupDefaultUniforms(pRVar11,dVar6);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,(ulong)dVar6);
    (**(code **)(program.m_program.m_info.linkTimeUs + 0xc18))(0x8b8b,this->m_hint);
    dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar6,"Setup program state",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                    ,0x2fd);
    pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1a00);
    iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
    iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
    (*pcVar2)(local_1158,local_1170,iVar5,iVar9);
    pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    glu::pr::Triangles((PrimitiveList *)local_d58,6,(deUint16 *)&biasLoc);
    glu::draw(pRVar11,dVar6,2,(VertexArrayBinding *)local_cd8,(PrimitiveList *)local_d58,
              (DrawUtilCallback *)0x0);
    dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar6,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                    ,0x302);
    local_1640 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
    do {
      local_1640 = local_1640 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_1640);
    } while (local_1640 != (VertexArrayBinding *)local_cd8);
    bVar4 = false;
    if ((viewportSize.m_data[1]._3_1_ & 1) != 0) {
      bVar4 = 0 < this->m_numSamples;
    }
    anon_unknown_6::AutoFbo::AutoFbo
              ((AutoFbo *)&resRbo.m_rbo,(Functions *)program.m_program.m_info.linkTimeUs);
    anon_unknown_6::AutoRbo::AutoRbo
              ((AutoRbo *)local_d80,(Functions *)program.m_program.m_info.linkTimeUs);
    if (bVar4) {
      anon_unknown_6::AutoFbo::gen((AutoFbo *)&resRbo.m_rbo);
      anon_unknown_6::AutoRbo::gen((AutoRbo *)local_d80);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0xa0);
      dVar6 = anon_unknown_6::AutoRbo::operator*((AutoRbo *)local_d80);
      (*pcVar2)(0x8d41,dVar6);
      iVar5 = viewportSize.m_data[0];
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1240);
      iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      (*pcVar2)(0x8d41,0,iVar5,iVar9,iVar7);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x78);
      dVar6 = anon_unknown_6::AutoFbo::operator*((AutoFbo *)&resRbo.m_rbo);
      (*pcVar2)(0x8ca9,dVar6);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x688);
      dVar6 = anon_unknown_6::AutoRbo::operator*((AutoRbo *)local_d80);
      (*pcVar2)(0x8ca9,0x8ce0,0x8d41,dVar6);
      do {
        dVar8 = ::deGetFalse();
        if ((dVar8 != 0) ||
           (iVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x170))(0x8d40),
           iVar5 != 0x8cd5)) {
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,(char *)0x0,
                     "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                     ,0x315);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x140);
      iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      iVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      (*pcVar2)(0,0,iVar5,iVar9,0,0,iVar7,iVar10,0x4000,0x2600);
      dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar6,"Resolve blit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                      ,0x318);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x78);
      dVar6 = anon_unknown_6::AutoFbo::operator*((AutoFbo *)&resRbo.m_rbo);
      (*pcVar2)(0x8ca8,dVar6);
    }
    if (this->m_surfaceType < SURFACETYPE_FLOAT_FBO) {
      tcu::TextureFormat::TextureFormat(&local_d88,RGBA,UNORM_INT8);
      iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      tcu::TextureLevel::setStorage((TextureLevel *)local_258,&local_d88,iVar5,iVar9,1);
      pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&dataFormat,(TextureLevel *)local_258);
      glu::readPixels(pRVar11,local_1158,local_1170,(PixelBufferAccess *)&dataFormat);
    }
    else if (this->m_surfaceType == SURFACETYPE_FLOAT_FBO) {
      tcu::TextureFormat::TextureFormat(&transferFormat,RGBA,FLOAT);
      tcu::TextureFormat::TextureFormat(&local_dc0,RGBA,UNSIGNED_INT32);
      iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&viewportY);
      iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&viewportY);
      tcu::TextureLevel::setStorage((TextureLevel *)local_258,&transferFormat,iVar5,iVar9,1);
      pRVar11 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      iVar5 = tcu::TextureLevel::getWidth((TextureLevel *)local_258);
      iVar9 = tcu::TextureLevel::getHeight((TextureLevel *)local_258);
      iVar7 = tcu::TextureLevel::getDepth((TextureLevel *)local_258);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&errorMask.m_pixels.m_cap,(TextureLevel *)local_258);
      data = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&errorMask.m_pixels.m_cap);
      tcu::PixelBufferAccess::PixelBufferAccess(&local_de8,&local_dc0,iVar5,iVar9,iVar7,data);
      glu::readPixels(pRVar11,local_1158,local_1170,&local_de8);
    }
    dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar6,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                    ,0x334);
    anon_unknown_6::AutoRbo::~AutoRbo((AutoRbo *)local_d80);
    anon_unknown_6::AutoFbo::~AutoFbo((AutoFbo *)&resRbo.m_rbo);
    iVar5 = tcu::TextureLevel::getWidth((TextureLevel *)local_258);
    iVar9 = tcu::TextureLevel::getHeight((TextureLevel *)local_258);
    tcu::Surface::Surface((Surface *)local_e28,iVar5,iVar9);
    tcu::Surface::getAccess(&local_e50,(Surface *)local_e28);
    local_e64 = (deUint32)tcu::RGBA::green();
    tcu::RGBA::toVec((RGBA *)local_e60);
    tcu::clear(&local_e50,(Vec4 *)local_e60);
    tcu::TextureLevel::getAccess(&local_e90,(TextureLevel *)local_258);
    tcu::Surface::getAccess(&local_eb8,(Surface *)local_e28);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,&local_e90,&local_eb8);
    local_e65 = (byte)iVar5 & 1;
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f18,"Result",&local_f19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f40,"Result images",&local_f41);
    tcu::LogImageSet::LogImageSet(&local_ef8,&local_f18,&local_f40);
    pTVar13 = tcu::TestLog::operator<<(pTVar13,&local_ef8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff8,"Rendered",&local_ff9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1020,"Rendered image",&local_1021);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1050,(TextureLevel *)local_258);
    tcu::LogImage::LogImage
              (&local_fd8,&local_ff8,&local_1020,&local_1050,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar13,&local_fd8);
    tcu::LogImage::~LogImage(&local_fd8);
    std::__cxx11::string::~string((string *)&local_1020);
    std::allocator<char>::~allocator(&local_1021);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::allocator<char>::~allocator(&local_ff9);
    tcu::LogImageSet::~LogImageSet(&local_ef8);
    std::__cxx11::string::~string((string *)&local_f40);
    std::allocator<char>::~allocator(&local_f41);
    std::__cxx11::string::~string((string *)&local_f18);
    std::allocator<char>::~allocator(&local_f19);
    if ((local_e65 & 1) == 0) {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1100,"ErrorMask",&local_1101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1128,"Error mask",&local_1129);
      tcu::LogImage::LogImage
                (&local_10e0,&local_1100,&local_1128,(Surface *)local_e28,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<(pTVar13,&local_10e0);
      tcu::LogImage::~LogImage(&local_10e0);
      std::__cxx11::string::~string((string *)&local_1128);
      std::allocator<char>::~allocator(&local_1129);
      std::__cxx11::string::~string((string *)&local_1100);
      std::allocator<char>::~allocator(&local_1101);
    }
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(pTVar13,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    pcVar12 = "Image comparison failed";
    if ((local_e65 & 1) != 0) {
      pcVar12 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~local_e65 & QP_TEST_RESULT_FAIL,pcVar12);
    tcu::Surface::~Surface((Surface *)local_e28);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_258);
    anon_unknown_6::AutoRbo::~AutoRbo((AutoRbo *)&result.m_data.m_cap);
    anon_unknown_6::AutoFbo::~AutoFbo((AutoFbo *)&rbo.m_rbo);
    de::Random::~Random((Random *)&fboFormat);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
    return STOP;
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
             ,0x296);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TriangleDerivateCase::IterateResult TriangleDerivateCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(genVertexSource(m_coordDataType, m_coordPrecision), m_fragmentSrc));
	de::Random					rnd				(deStringHash(getName()) ^ 0xbbc24);
	const bool					useFbo			= m_surfaceType != SURFACETYPE_DEFAULT_FRAMEBUFFER;
	const deUint32				fboFormat		= m_surfaceType == SURFACETYPE_FLOAT_FBO ? GL_RGBA32UI : GL_RGBA8;
	const tcu::IVec2			viewportSize	= getViewportSize();
	const int					viewportX		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getWidth()		- viewportSize.x());
	const int					viewportY		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getHeight()	- viewportSize.y());
	AutoFbo						fbo				(gl);
	AutoRbo						rbo				(gl);
	tcu::TextureLevel			result;

	m_testCtx.getLog() << program;

	if (!program.isOk())
		TCU_FAIL("Compile failed");

	if (useFbo)
	{
		m_testCtx.getLog() << TestLog::Message
						   << "Rendering to FBO, format = " << glu::getTextureFormatStr(fboFormat)
						   << ", samples = " << m_numSamples
						   << TestLog::EndMessage;

		fbo.gen();
		rbo.gen();

		gl.bindRenderbuffer(GL_RENDERBUFFER, *rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, fboFormat, viewportSize.x(), viewportSize.y());
		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *rbo);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}
	else
	{
		const tcu::PixelFormat pixelFormat = m_context.getRenderTarget().getPixelFormat();

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Rendering to default framebuffer\n"
			<< "\tColor depth: R=" << pixelFormat.redBits << ", G=" << pixelFormat.greenBits << ", B=" << pixelFormat.blueBits << ", A=" << pixelFormat.alphaBits
			<< TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "in: " << m_coordMin << " -> " << m_coordMax << "\n"
										   << "v_coord.x = in.x * x\n"
										   << "v_coord.y = in.y * y\n"
										   << "v_coord.z = in.z * (x+y)/2\n"
										   << "v_coord.w = in.w * (1 - (x+y)/2)\n"
					   << TestLog::EndMessage
					   << TestLog::Message << "u_scale: " << m_derivScale << ", u_bias: " << m_derivBias << " (displayed values have scale/bias removed)" << TestLog::EndMessage
					   << TestLog::Message << "Viewport: " << viewportSize.x() << "x" << viewportSize.y() << TestLog::EndMessage
					   << TestLog::Message << "GL_FRAGMENT_SHADER_DERIVATE_HINT: " << glu::getHintModeStr(m_hint) << TestLog::EndMessage;

	// Draw
	{
		const float positions[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f,  1.0f, 0.0f, 1.0f,
			 1.0f, -1.0f, 0.0f, 1.0f,
			 1.0f,  1.0f, 0.0f, 1.0f
		};
		const float coords[] =
		{
			m_coordMin.x(), m_coordMin.y(), m_coordMin.z(),							m_coordMax.w(),
			m_coordMin.x(), m_coordMax.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMin.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMax.y(), m_coordMax.z(),							m_coordMin.w()
		};
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4, 4, 0, &positions[0]),
			glu::va::Float("a_coord",		4, 4, 0, &coords[0])
		};
		const deUint16 indices[] = { 0, 2, 1, 2, 3, 1 };

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DITHER);

		gl.useProgram(program.getProgram());

		{
			const int	scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			const int	biasLoc		= gl.getUniformLocation(program.getProgram(), "u_bias");

			switch (m_dataType)
			{
				case glu::TYPE_FLOAT:
					gl.uniform1f(scaleLoc, m_derivScale.x());
					gl.uniform1f(biasLoc, m_derivBias.x());
					break;

				case glu::TYPE_FLOAT_VEC2:
					gl.uniform2fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform2fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC3:
					gl.uniform3fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform3fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC4:
					gl.uniform4fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform4fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				default:
					DE_ASSERT(false);
			}
		}

		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());
		setupRenderState(program.getProgram());

		gl.hint(GL_FRAGMENT_SHADER_DERIVATIVE_HINT, m_hint);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup program state");

		gl.viewport(viewportX, viewportY, viewportSize.x(), viewportSize.y());
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
	}

	// Read back results
	{
		const bool		isMSAA		= useFbo && m_numSamples > 0;
		AutoFbo			resFbo		(gl);
		AutoRbo			resRbo		(gl);

		// Resolve if necessary
		if (isMSAA)
		{
			resFbo.gen();
			resRbo.gen();

			gl.bindRenderbuffer(GL_RENDERBUFFER, *resRbo);
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 0, fboFormat, viewportSize.x(), viewportSize.y());
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *resFbo);
			gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *resRbo);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			gl.blitFramebuffer(0, 0, viewportSize.x(), viewportSize.y(), 0, 0, viewportSize.x(), viewportSize.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Resolve blit");

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *resFbo);
		}

		switch (m_surfaceType)
		{
			case SURFACETYPE_DEFAULT_FRAMEBUFFER:
			case SURFACETYPE_UNORM_FBO:
				result.setStorage(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, result);
				break;

			case SURFACETYPE_FLOAT_FBO:
			{
				const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
				const tcu::TextureFormat	transferFormat	(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);

				result.setStorage(dataFormat, viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY,
								tcu::PixelBufferAccess(transferFormat, result.getWidth(), result.getHeight(), result.getDepth(), result.getAccess().getDataPtr()));
				break;
			}

			default:
				DE_ASSERT(false);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");
	}

	// Verify
	{
		tcu::Surface errorMask(result.getWidth(), result.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(result.getAccess(), errorMask.getAccess());

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Result images")
						   << TestLog::Image("Rendered", "Rendered image", result);

		if (!isOk)
			m_testCtx.getLog() << TestLog::Image("ErrorMask", "Error mask", errorMask);

		m_testCtx.getLog() << TestLog::EndImageSet;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}